

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O3

int __thiscall ncnn::Crop::forward(Crop *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint _w;
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  size_t _elemsize;
  void *pvVar5;
  ulong uVar6;
  int *piVar7;
  int h;
  int iVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  uint in_R10D;
  uint uVar14;
  ulong uVar15;
  void *in_R11;
  int iVar16;
  void *pvVar17;
  uint uVar18;
  void *pvVar19;
  int _axes [4];
  uint local_160;
  void *local_140;
  Mat local_128;
  void *local_e0;
  void *local_d8;
  int *piStack_d0;
  size_t local_c8;
  int local_c0;
  Allocator *local_b8;
  undefined4 local_b0;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  ulong local_a0;
  long local_98;
  long local_90;
  ulong local_88;
  size_t local_80;
  Allocator *local_78;
  Mat local_70;
  
  _w = bottom_blob->w;
  uVar1 = bottom_blob->h;
  uVar2 = bottom_blob->c;
  iVar3 = bottom_blob->dims;
  _elemsize = bottom_blob->elemsize;
  uVar18 = this->woffset;
  local_160 = this->hoffset;
  uVar11 = (ulong)local_160;
  uVar12 = this->coffset;
  iVar8 = this->woffset2;
  iVar16 = this->hoffset2;
  pvVar17 = (this->starts).data;
  local_140 = in_R11;
  uVar10 = _w;
  if ((((pvVar17 == (void *)0x0) ||
       (uVar11 = (long)(this->starts).c * (this->starts).cstep, local_140 = in_R11, uVar11 == 0)) ||
      (pvVar19 = (this->ends).data, local_140 = pvVar19, pvVar19 == (void *)0x0)) ||
     (uVar11 = (long)(this->ends).c * (this->ends).cstep, uVar11 == 0)) {
    if (iVar3 == 3) {
      uVar13 = this->outw;
      iVar8 = iVar8 + uVar18;
      if (uVar12 == 0xffffff17 && local_160 == 0xffffff17) {
        uVar12 = uVar2 - iVar8;
        local_140 = (void *)(ulong)uVar12;
        if ((uVar13 != 0xffffff17) &&
           (local_140 = (void *)(ulong)uVar12, (int)uVar13 <= (int)uVar12)) {
          local_140 = (void *)(ulong)uVar13;
        }
        local_160 = 0;
        uVar12 = uVar18;
        in_R10D = uVar1;
        uVar9 = 0;
      }
      else {
        uVar9 = this->outh;
        if (local_160 == 0xffffff17) {
          uVar12 = uVar1 - iVar8;
          in_R10D = uVar13;
          if ((int)uVar12 < (int)uVar13) {
            in_R10D = uVar12;
          }
          if (uVar13 == 0xffffff17) {
            in_R10D = uVar12;
          }
          uVar12 = (uVar2 - iVar16) + 0xe9;
          local_140 = (void *)(ulong)uVar12;
          if ((uVar9 != 0xffffff17) &&
             (local_140 = (void *)(ulong)uVar12, (int)uVar9 <= (int)uVar12)) {
            local_140 = (void *)(ulong)uVar9;
          }
          uVar12 = 0xffffff17;
          uVar9 = 0;
          local_160 = uVar18;
        }
        else {
          uVar14 = _w - iVar8;
          uVar10 = uVar13;
          if ((int)uVar14 < (int)uVar13) {
            uVar10 = uVar14;
          }
          if (uVar13 == 0xffffff17) {
            uVar10 = uVar14;
          }
          uVar13 = uVar1 - (iVar16 + local_160);
          in_R10D = uVar9;
          if ((int)uVar13 < (int)uVar9) {
            in_R10D = uVar13;
          }
          if (uVar9 == 0xffffff17) {
            in_R10D = uVar13;
          }
          uVar13 = this->outc;
          uVar14 = uVar2 - (this->coffset2 + uVar12);
          local_140 = (void *)(ulong)uVar14;
          uVar9 = uVar18;
          if ((uVar13 != 0xffffff17) &&
             (local_140 = (void *)(ulong)uVar14, (int)uVar13 <= (int)uVar14)) {
            local_140 = (void *)(ulong)uVar13;
          }
        }
      }
      goto LAB_001313b3;
    }
    if (iVar3 != 2) {
      uVar10 = (uint)uVar11;
      if (iVar3 != 1) goto LAB_00131246;
      uVar1 = this->outw;
      uVar10 = _w - (iVar8 + uVar18);
      if ((uVar1 != 0xffffff17) && ((int)uVar1 <= (int)uVar10)) {
        uVar10 = uVar1;
      }
      goto LAB_00131259;
    }
    uVar2 = this->outw;
    if (local_160 == 0xffffff17) {
      in_R10D = uVar1 - (iVar8 + uVar18);
      uVar12 = 0;
      local_160 = uVar18;
      if ((uVar2 != 0xffffff17) && ((int)uVar2 <= (int)in_R10D)) {
        in_R10D = uVar2;
      }
    }
    else {
      uVar12 = _w - (iVar8 + uVar18);
      uVar10 = uVar2;
      if ((int)uVar12 < (int)uVar2) {
        uVar10 = uVar12;
      }
      if (uVar2 == 0xffffff17) {
        uVar10 = uVar12;
      }
      uVar2 = this->outh;
      in_R10D = uVar1 - (iVar16 + local_160);
      uVar12 = uVar18;
      if ((uVar2 != 0xffffff17) && ((int)uVar2 <= (int)in_R10D)) {
        in_R10D = uVar2;
      }
    }
  }
  else {
    pvVar5 = (this->axes).data;
    local_d8 = (void *)0x100000000;
    piStack_d0 = (int *)0x300000002;
    uVar18 = (this->axes).w;
    uVar11 = (ulong)uVar18;
    if (uVar11 == 0) {
      uVar11 = (ulong)(iVar3 + 1);
LAB_00131124:
      if ((int)uVar11 < 1) goto LAB_00131227;
      uVar15 = 0;
      uVar18 = 0;
      local_160 = 0;
      uVar12 = 0;
      local_140 = (void *)(ulong)uVar2;
      in_R10D = uVar1;
      do {
        iVar8 = *(int *)((long)&local_d8 + uVar15 * 4);
        if (iVar8 != 0) {
          iVar16 = *(int *)((long)pvVar17 + uVar15 * 4);
          iVar4 = *(int *)((long)pvVar19 + uVar15 * 4);
          uVar13 = iVar16 >> 0x1f;
          if (iVar3 == 3) {
            if (iVar8 == 3) goto LAB_001311bb;
            if (iVar8 == 2) {
LAB_001311e5:
              uVar9 = 0;
              if (iVar4 < 1) {
                uVar9 = uVar1;
              }
              local_160 = (uVar13 & uVar1) + iVar16;
              uVar13 = uVar9 + iVar4;
              if ((int)uVar1 <= (int)(uVar9 + iVar4)) {
                uVar13 = uVar1;
              }
              in_R10D = uVar13 - uVar18;
            }
            else if (iVar8 == 1) {
              uVar9 = 0;
              if (iVar4 < 1) {
                uVar9 = uVar2;
              }
              uVar12 = (uVar13 & uVar2) + iVar16;
              uVar13 = uVar9 + iVar4;
              if ((int)uVar2 <= (int)(uVar9 + iVar4)) {
                uVar13 = uVar2;
              }
              local_140 = (void *)(ulong)(uVar13 - uVar12);
            }
          }
          else if (iVar3 == 2) {
            if (iVar8 == 2) goto LAB_001311bb;
            if (iVar8 == 1) goto LAB_001311e5;
          }
          else if (iVar3 == 1) {
LAB_001311bb:
            uVar9 = 0;
            if (iVar4 < 1) {
              uVar9 = _w;
            }
            uVar18 = (uVar13 & _w) + iVar16;
            uVar10 = uVar9 + iVar4;
            if ((int)_w <= (int)(uVar9 + iVar4)) {
              uVar10 = _w;
            }
            uVar10 = uVar10 - uVar18;
          }
        }
        uVar15 = uVar15 + 1;
      } while (uVar11 != uVar15);
    }
    else {
      if (0 < (int)uVar18) {
        uVar15 = 0;
        do {
          iVar8 = *(int *)((long)pvVar5 + uVar15 * 4);
          *(uint *)((long)&local_d8 + uVar15 * 4) = (iVar8 >> 0x1f & iVar3 + 1U) + iVar8;
          uVar15 = uVar15 + 1;
        } while (uVar11 != uVar15);
        goto LAB_00131124;
      }
LAB_00131227:
      uVar12 = 0;
      local_140 = (void *)(ulong)uVar2;
      local_160 = 0;
      uVar18 = 0;
      in_R10D = uVar1;
    }
LAB_00131246:
    uVar9 = uVar18;
    if (iVar3 == 3) {
LAB_001313b3:
      uVar18 = (uint)local_140;
      if ((in_R10D != uVar1 || uVar10 != _w) || (uVar18 != uVar2)) {
        local_e0 = (void *)((long)(int)uVar12 * _elemsize * bottom_blob->cstep +
                           (long)bottom_blob->data);
        iVar3 = bottom_blob->elempack;
        local_b8 = bottom_blob->allocator;
        piStack_d0 = (int *)0x0;
        local_b0 = 3;
        local_80 = (size_t)(int)(uVar1 * _w);
        uVar11 = (_elemsize * local_80 + 0xf & 0xfffffffffffffff0) / _elemsize;
        local_d8 = local_e0;
        local_c8 = _elemsize;
        local_c0 = iVar3;
        local_ac = _w;
        local_a8 = uVar1;
        local_a4 = uVar18;
        local_a0 = uVar11;
        local_78 = local_b8;
        if (in_R10D != uVar1 || uVar10 != _w) {
          Mat::create(top_blob,uVar10,in_R10D,uVar18,_elemsize,opt->blob_allocator);
          iVar8 = -100;
          if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
          goto LAB_00131916;
          if (0 < (int)uVar18) {
            local_90 = (long)(int)uVar9;
            local_98 = (long)(int)(_w * local_160);
            uVar15 = 0;
            local_88 = (ulong)local_140 & 0xffffffff;
            do {
              local_128.data = (void *)(uVar11 * _elemsize * uVar15 + (long)local_e0);
              local_128.refcount._0_4_ = 0;
              local_128.refcount._4_4_ = 0;
              local_128.elemsize._0_4_ = (undefined4)_elemsize;
              local_128.elemsize._4_4_ = (undefined4)(_elemsize >> 0x20);
              local_128.allocator = local_78;
              local_128.w = _w;
              local_128.dims = 2;
              local_128.c = 1;
              local_128.h = uVar1;
              local_128.cstep = local_80;
              uVar2 = top_blob->w;
              iVar8 = top_blob->h;
              local_70.elemsize = top_blob->elemsize;
              pvVar17 = (void *)(top_blob->cstep * uVar15 * local_70.elemsize + (long)top_blob->data
                                );
              local_70.elempack = top_blob->elempack;
              local_70.allocator = top_blob->allocator;
              local_70.refcount = (int *)0x0;
              local_70.dims = 2;
              local_70.c = 1;
              local_70.cstep = (size_t)(int)(iVar8 * uVar2);
              local_128.elempack = iVar3;
              local_70.data = pvVar17;
              local_70.w = uVar2;
              local_70.h = iVar8;
              if (_elemsize == 4) {
                copy_cut_border_image<float>(&local_128,&local_70,local_160,uVar9);
              }
              else if ((_elemsize == 1) && (0 < iVar8)) {
                pvVar19 = (void *)((long)local_128.data + local_90 + local_98);
                iVar16 = 0;
                do {
                  if ((int)uVar2 < 0xc) {
                    if (0 < (int)uVar2) {
                      uVar6 = 0;
                      do {
                        *(undefined1 *)((long)pvVar17 + uVar6) =
                             *(undefined1 *)((long)pvVar19 + uVar6);
                        uVar6 = uVar6 + 1;
                      } while (uVar2 != uVar6);
                    }
                  }
                  else {
                    memcpy(pvVar17,pvVar19,(ulong)uVar2);
                  }
                  pvVar17 = (void *)((long)pvVar17 + (long)(int)uVar2);
                  pvVar19 = (void *)((long)pvVar19 + (long)(int)_w);
                  iVar16 = iVar16 + 1;
                } while (iVar16 != iVar8);
              }
              uVar15 = uVar15 + 1;
            } while (uVar15 != local_88);
          }
        }
        else {
          if ((bottom_blob->data == (void *)0x0) || (uVar11 * (long)(int)uVar18 == 0)) {
            local_128.elemsize._0_4_ = 0;
            local_128.elemsize._4_4_ = 0;
            local_128.elempack = 0;
            local_128.data = (void *)0x0;
            local_128.refcount._0_4_ = 0;
            local_128.refcount._4_4_ = 0;
            local_128.allocator = (Allocator *)0x0;
            local_128.dims = 0;
            local_128.w = 0;
            local_128.h = 0;
            local_128.c = 0;
            local_128.cstep = 0;
          }
          else {
            local_128.elemsize._0_4_ = 0;
            local_128.elemsize._4_4_ = 0;
            local_128.elempack = 0;
            local_128.data = (void *)0x0;
            local_128.refcount._0_4_ = 0;
            local_128.refcount._4_4_ = 0;
            local_128.allocator = (Allocator *)0x0;
            local_128.dims = 0;
            local_128.w = 0;
            local_128.h = 0;
            local_128.c = 0;
            local_128.cstep = 0;
            Mat::create(&local_128,_w,uVar1,uVar18,_elemsize,iVar3,(Allocator *)0x0);
            memcpy(local_128.data,local_e0,_elemsize * uVar11 * (long)(int)uVar18);
          }
          piVar7 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
          if (&local_128 != top_blob) {
            if (piVar7 != (int *)0x0) {
              LOCK();
              *piVar7 = *piVar7 + 1;
              UNLOCK();
            }
            piVar7 = top_blob->refcount;
            if (piVar7 != (int *)0x0) {
              LOCK();
              *piVar7 = *piVar7 + -1;
              UNLOCK();
              if (*piVar7 == 0) {
                if (top_blob->allocator == (Allocator *)0x0) {
                  if (top_blob->data != (void *)0x0) {
                    free(top_blob->data);
                  }
                }
                else {
                  (*top_blob->allocator->_vptr_Allocator[3])();
                }
              }
            }
            top_blob->data = local_128.data;
            piVar7 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
            top_blob->refcount = piVar7;
            top_blob->elemsize = CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize);
            top_blob->elempack = local_128.elempack;
            top_blob->allocator = local_128.allocator;
            top_blob->dims = local_128.dims;
            top_blob->w = local_128.w;
            top_blob->h = local_128.h;
            top_blob->c = local_128.c;
            top_blob->cstep = local_128.cstep;
          }
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              if (local_128.allocator == (Allocator *)0x0) {
                if (local_128.data != (void *)0x0) {
                  free(local_128.data);
                }
              }
              else {
                (*(local_128.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0)) {
            iVar8 = -100;
            goto LAB_00131916;
          }
        }
        iVar8 = 0;
LAB_00131916:
        if (piStack_d0 == (int *)0x0) {
          return iVar8;
        }
        LOCK();
        *piStack_d0 = *piStack_d0 + -1;
        UNLOCK();
        if (*piStack_d0 != 0) {
          return iVar8;
        }
        if (local_b8 != (Allocator *)0x0) {
          (*local_b8->_vptr_Allocator[3])();
          return iVar8;
        }
        if (local_d8 != (void *)0x0) {
          free(local_d8);
          return iVar8;
        }
        return iVar8;
      }
      goto LAB_001313cb;
    }
    uVar12 = uVar18;
    if (iVar3 != 2) {
      if (iVar3 != 1) {
        return 0;
      }
LAB_00131259:
      if (uVar10 != _w) {
        Mat::create(top_blob,uVar10,_elemsize,opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep == 0) {
          return -100;
        }
        uVar12 = uVar18;
        if (_elemsize == 4) {
          local_160 = 0;
          goto LAB_00131876;
        }
        if (_elemsize != 1) {
          return 0;
        }
        local_160 = 0;
        goto LAB_0013134d;
      }
      goto LAB_001313cb;
    }
  }
  if ((uVar10 != _w) || (in_R10D != uVar1)) {
    Mat::create(top_blob,uVar10,in_R10D,_elemsize,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    if (_elemsize == 4) {
LAB_00131876:
      copy_cut_border_image<float>(bottom_blob,top_blob,local_160,uVar12);
      return 0;
    }
    if (_elemsize != 1) {
      return 0;
    }
LAB_0013134d:
    copy_cut_border_image<signed_char>(bottom_blob,top_blob,local_160,uVar12);
    return 0;
  }
LAB_001313cb:
  if (top_blob != bottom_blob) {
    piVar7 = bottom_blob->refcount;
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + 1;
      UNLOCK();
    }
    piVar7 = top_blob->refcount;
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        if (top_blob->allocator == (Allocator *)0x0) {
          if (top_blob->data != (void *)0x0) {
            free(top_blob->data);
          }
        }
        else {
          (*top_blob->allocator->_vptr_Allocator[3])();
        }
      }
    }
    *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
    *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->h = 0;
    top_blob->c = 0;
    top_blob->cstep = 0;
    piVar7 = bottom_blob->refcount;
    top_blob->data = bottom_blob->data;
    top_blob->refcount = piVar7;
    top_blob->elemsize = bottom_blob->elemsize;
    top_blob->elempack = bottom_blob->elempack;
    top_blob->allocator = bottom_blob->allocator;
    iVar3 = bottom_blob->w;
    iVar8 = bottom_blob->h;
    iVar16 = bottom_blob->c;
    top_blob->dims = bottom_blob->dims;
    top_blob->w = iVar3;
    top_blob->h = iVar8;
    top_blob->c = iVar16;
    top_blob->cstep = bottom_blob->cstep;
  }
  return 0;
}

Assistant:

int Crop::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    int _woffset = woffset;
    int _hoffset = hoffset;
    int _coffset = coffset;
    int _woffset2 = woffset2;
    int _hoffset2 = hoffset2;
    int _coffset2 = coffset2;
    int _outw;
    int _outh;
    int _outc;

    bool numpy_style_slice = !starts.empty() && !ends.empty();
    if (numpy_style_slice)
    {
        _woffset = 0;
        _hoffset = 0;
        _coffset = 0;
        _outw = w;
        _outh = h;
        _outc = channels;

        const int* starts_ptr = starts;
        const int* ends_ptr = ends;
        const int* axes_ptr = axes;

        int _axes[4] = {0,1,2,3};
        int num_axis = axes.w;
        if (num_axis == 0)
        {
            num_axis = dims + 1;// +1 for N-dim
        }
        else
        {
            for (int i=0; i<num_axis; i++)
            {
                int axis = axes_ptr[i];
                if (axis < 0)
                    axis = dims + 1 + axis;// +1 for N-dim
                _axes[i] = axis;
            }
        }

        for (int i=0; i<num_axis; i++)
        {
            int axis = _axes[i];
            if (axis == 0)
                continue;// skip N-dim

            int start = starts_ptr[i];
            int end = ends_ptr[i];

            if (dims == 1) // axis == 1
            {
                _woffset = start >= 0 ? start : w + start;
                _outw = std::min(w, end > 0 ? end : w + end) - _woffset;
            }
            if (dims == 2)
            {
                if (axis == 1)
                {
                    _hoffset = start >= 0 ? start : h + start;
                    _outh = std::min(h, end > 0 ? end : h + end) - _woffset;
                }
                if (axis == 2)
                {
                    _woffset = start >= 0 ? start : w + start;
                    _outw = std::min(w, end > 0 ? end : w + end) - _woffset;
                }
            }
            if (dims == 3)
            {
                if (axis == 1)
                {
                    _coffset = start >= 0 ? start : channels + start;
                    _outc = std::min(channels, end > 0 ? end : channels + end) - _coffset;
                }
                if (axis == 2)
                {
                    _hoffset = start >= 0 ? start : h + start;
                    _outh = std::min(h, end > 0 ? end : h + end) - _woffset;
                }
                if (axis == 3)
                {
                    _woffset = start >= 0 ? start : w + start;
                    _outw = std::min(w, end > 0 ? end : w + end) - _woffset;
                }
            }
        }
    }
    else
    {
        if (dims == 1)
        {
            if (outw == -233)
                _outw = w - _woffset - _woffset2;
            else
                _outw = std::min(outw, w - _woffset - _woffset2);
        }
        if (dims == 2)
        {
            if (_hoffset == -233)
            {
                _woffset = 0;
                _woffset2 = 0;
                _outw = w;

                _hoffset = woffset;
                _hoffset2 = woffset2;

                if (outw == -233)
                    _outh = h - _hoffset - _hoffset2;
                else
                    _outh = std::min(outw, h - _hoffset - _hoffset2);
            }
            else
            {
                if (outw == -233)
                    _outw = w - _woffset - _woffset2;
                else
                    _outw = std::min(outw, w - _woffset - _woffset2);

                if (outh == -233)
                    _outh = h - _hoffset - _hoffset2;
                else
                    _outh = std::min(outh, h - _hoffset - _hoffset2);
            }
        }
        if (dims == 3)
        {
            if (_hoffset == -233 && _coffset == -233)
            {
                _woffset = 0;
                _woffset2 = 0;
                _outw = w;
                _hoffset = 0;
                _hoffset2 = 0;
                _outh = h;

                _coffset = woffset;
                _coffset2 = woffset2;

                if (outw == -233)
                    _outc = channels - _coffset - _coffset2;
                else
                    _outc = std::min(outw, channels - _coffset - _coffset2);
            }
            else if (_hoffset == -233)
            {
                _woffset = 0;
                _woffset2 = 0;
                _outw = w;

                _hoffset = woffset;
                _hoffset2 = woffset2;

                if (outw == -233)
                    _outh = h - _hoffset - _hoffset2;
                else
                    _outh = std::min(outw, h - _hoffset - _hoffset2);

                _coffset = hoffset;
                _coffset2 = hoffset2;

                if (outh == -233)
                    _outc = channels - _coffset - _coffset2;
                else
                    _outc = std::min(outh, channels - _coffset - _coffset2);
            }
            else
            {
                if (outw == -233)
                    _outw = w - _woffset - _woffset2;
                else
                    _outw = std::min(outw, w - _woffset - _woffset2);

                if (outh == -233)
                    _outh = h - _hoffset - _hoffset2;
                else
                    _outh = std::min(outh, h - _hoffset - _hoffset2);

                if (outc == -233)
                    _outc = channels - _coffset - _coffset2;
                else
                    _outc = std::min(outc, channels - _coffset - _coffset2);
            }
        }
    }

    if (dims == 1)
    {
        if (_outw == w)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_outw, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob, top_blob, 0, _woffset);
        else if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob, top_blob, 0, _woffset);

        return 0;
    }

    if (dims == 2)
    {
        if (_outw == w && _outh == h)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_outw, _outh, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob, top_blob, _hoffset, _woffset);
        else if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob, top_blob, _hoffset, _woffset);

        return 0;
    }

    if (dims == 3)
    {
        if (_outw == w && _outh == h && _outc == channels)
        {
            top_blob = bottom_blob;
            return 0;
        }

        const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset, _outc);

        if (_outw == w && _outh == h)
        {
            top_blob = bottom_blob_sliced.clone();
            if (top_blob.empty())
                return -100;

            return 0;
        }

        top_blob.create(_outw, _outh, _outc, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<_outc; q++)
        {
            const Mat m = bottom_blob_sliced.channel(q);
            Mat borderm = top_blob.channel(q);

            if (elemsize == 1)
                copy_cut_border_image<signed char>(m, borderm, _hoffset, _woffset);
            else if (elemsize == 4)
                copy_cut_border_image<float>(m, borderm, _hoffset, _woffset);
        }

        return 0;
    }

    return 0;
}